

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall TPZVec<char>::TPZVec(TPZVec<char> *this,TPZVec<char> *copy)

{
  int64_t i;
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_01814070;
  this->fStore = (char *)0x0;
  uVar3 = copy->fNElements;
  if (0 < (long)uVar3) {
    pcVar1 = (char *)operator_new__(uVar3);
    this->fStore = pcVar1;
    lVar2 = 0;
    do {
      this->fStore[lVar2] = copy->fStore[lVar2];
      lVar2 = lVar2 + 1;
      uVar3 = copy->fNElements;
    } while (lVar2 < (long)uVar3);
  }
  this->fNElements = uVar3;
  this->fNAlloc = copy->fNAlloc;
  return;
}

Assistant:

TPZVec<T>::TPZVec(const TPZVec<T> &copy){
	fStore = nullptr;
	
	if( copy.fNElements > 0 )
		fStore = new T[copy.fNElements];
	else
		fStore = nullptr;
	
	for(int64_t i=0; i<copy.fNElements; i++)
		fStore[i]=copy.fStore[i];
	
	fNElements = copy.fNElements;
    fNAlloc = copy.fNAlloc;
}